

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

void Acb_ObjUpdatePriority(Acb_Ntk_t *p,int iObj)

{
  float *pfVar1;
  int iVar2;
  int iVar3;
  Vec_Que_t *pVVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int *piVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  iVar2 = Acb_ObjIsCio(p,iObj);
  if (iVar2 == 0) {
    iVar2 = Acb_ObjLevelD(p,iObj);
    if (iVar2 != 1) {
      if (p->vQue == (Vec_Que_t *)0x0) {
        Acb_NtkCleanObjCounts(p);
        pVVar4 = (Vec_Que_t *)calloc(1,0x20);
        pVVar4->nCap = 0x3e9;
        pVVar4->nSize = 1;
        piVar5 = (int *)malloc(0xfa4);
        memset(piVar5,0xff,0xfa4);
        pVVar4->pHeap = piVar5;
        piVar5 = (int *)malloc(0xfa4);
        memset(piVar5,0xff,0xfa4);
        pVVar4->pOrder = piVar5;
        p->vQue = pVVar4;
        Vec_QueSetPriority(pVVar4,&(p->vCounts).pArray);
      }
      iVar2 = Acb_ObjPathD(p,iObj);
      iVar3 = Acb_ObjPathR(p,iObj);
      if ((iObj < 0) || ((p->vCounts).nSize <= iObj)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                      ,0x184,"void Vec_FltWriteEntry(Vec_Flt_t *, int, float)");
      }
      (p->vCounts).pArray[(uint)iObj] = (float)(iVar3 * iVar2);
      pVVar4 = p->vQue;
      iVar6 = pVVar4->nCap;
      if ((iObj < iVar6) && (-1 < pVVar4->pOrder[(uint)iObj])) {
        iVar2 = Vec_QueMoveUp(pVVar4,iObj);
        if (iVar2 == 0) {
          pfVar1 = *pVVar4->pCostsFlt;
          if (pfVar1 == (float *)0x0) {
            fVar11 = (float)iObj;
          }
          else {
            fVar11 = pfVar1[(uint)iObj];
          }
          piVar5 = pVVar4->pOrder;
          uVar7 = piVar5[(uint)iObj];
          while( true ) {
            uVar8 = uVar7 * 2;
            iVar2 = pVVar4->nSize;
            if (iVar2 <= (int)uVar8) break;
            uVar10 = uVar8 | 1;
            if ((int)uVar10 < iVar2) {
              piVar9 = pVVar4->pHeap;
              if (pfVar1 == (float *)0x0) {
                fVar12 = (float)piVar9[(int)uVar8];
                fVar13 = (float)piVar9[(int)uVar10];
              }
              else {
                fVar12 = pfVar1[piVar9[(int)uVar8]];
                fVar13 = pfVar1[piVar9[(int)uVar10]];
              }
              if (fVar12 < fVar13) {
                uVar8 = uVar10;
              }
            }
            if (iVar2 <= (int)uVar8) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            piVar9 = pVVar4->pHeap;
            iVar2 = piVar9[(int)uVar8];
            if (pfVar1 == (float *)0x0) {
              fVar12 = (float)iVar2;
            }
            else {
              fVar12 = pfVar1[iVar2];
            }
            if (fVar12 <= fVar11) goto LAB_0033569c;
            piVar9[(int)uVar7] = iVar2;
            piVar5[iVar2] = uVar7;
            uVar7 = uVar8;
          }
          piVar9 = pVVar4->pHeap;
LAB_0033569c:
          piVar9[(int)uVar7] = iObj;
          piVar5[(uint)iObj] = uVar7;
        }
      }
      else if (iVar3 * iVar2 != 0) {
        if (iVar6 <= pVVar4->nSize) {
          iVar3 = pVVar4->nSize + 1;
          iVar2 = iVar6 * 2;
          if (iVar6 * 2 < iVar3) {
            iVar2 = iVar3;
          }
          Vec_QueGrow(pVVar4,iVar2);
          iVar6 = pVVar4->nCap;
        }
        if (iVar6 <= iObj) {
          iVar3 = iObj + 1;
          iVar2 = iVar6 * 2;
          if (iVar3 != iVar2 && SBORROW4(iVar3,iVar2) == iVar3 + iVar6 * -2 < 0) {
            iVar2 = iVar3;
          }
          Vec_QueGrow(pVVar4,iVar2);
          iVar6 = pVVar4->nCap;
        }
        iVar2 = pVVar4->nSize;
        if (iVar6 <= iVar2) {
          __assert_fail("p->nSize < p->nCap",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        if (pVVar4->pOrder[(uint)iObj] != -1) {
          __assert_fail("p->pOrder[v] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                        ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
        }
        piVar5 = pVVar4->pHeap;
        if (piVar5[iVar2] == -1) {
          pVVar4->pOrder[(uint)iObj] = iVar2;
          iVar2 = pVVar4->nSize;
          pVVar4->nSize = iVar2 + 1;
          piVar5[iVar2] = iObj;
          Vec_QueMoveUp(pVVar4,iObj);
          return;
        }
        __assert_fail("p->pHeap[p->nSize] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
      }
    }
  }
  return;
}

Assistant:

void Acb_ObjUpdatePriority( Acb_Ntk_t * p, int iObj )
{
    int nPaths;
    if ( Acb_ObjIsCio(p, iObj) || Acb_ObjLevelD(p, iObj) == 1 )
        return;
    if ( p->vQue == NULL )
    {
        Acb_NtkCleanObjCounts( p );
        p->vQue = Vec_QueAlloc( 1000 );
        Vec_QueSetPriority( p->vQue, Vec_FltArrayP(&p->vCounts) );
    }
    nPaths = Acb_ObjPathD(p, iObj) * Acb_ObjPathR(p, iObj);
    Acb_ObjSetCounts( p, iObj, (float)nPaths );
    if ( Vec_QueIsMember( p->vQue, iObj ) )
    {
//printf( "Updating object %d with count %d\n", iObj, nPaths );
        Vec_QueUpdate( p->vQue, iObj );
    }
    else if ( nPaths )
    {
//printf( "Adding object %d with count %d\n", iObj, nPaths );
        Vec_QuePush( p->vQue, iObj );
    }
}